

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc_manager_direct.cc
# Opt level: O1

void __thiscall webrtc::AgcManagerDirect::UpdateGain(AgcManagerDirect *this)

{
  int *piVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  int *piVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int rms_error;
  LogMessage local_1b0;
  
  cVar2 = (**(code **)((long)((this->agc_)._M_t.
                              super___uniq_ptr_impl<webrtc::Agc,_std::default_delete<webrtc::Agc>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_webrtc::Agc_*,_std::default_delete<webrtc::Agc>_>
                              .super__Head_base<0UL,_webrtc::Agc_*,_false>._M_head_impl)->_vptr_Agc
                      + 0x20))();
  if (cVar2 != '\0') {
    iVar4 = this->max_compression_gain_;
    iVar10 = 2;
    if (iVar4 < 2) {
      iVar10 = iVar4;
    }
    iVar9 = 2;
    if (2 < iVar10) {
      iVar9 = iVar10;
    }
    if (((iVar9 == iVar4) && (this->target_compression_ == iVar4 + -1)) ||
       (iVar4 = this->target_compression_, iVar4 == 3 && iVar10 < 3)) {
      this->target_compression_ = iVar9;
    }
    else {
      this->target_compression_ = (iVar9 - iVar4) / 2 + iVar4;
    }
    iVar10 = 2 - iVar9;
    iVar4 = -0xf;
    if (-0xf < iVar10) {
      iVar4 = iVar10;
    }
    iVar7 = 0xf;
    if (iVar4 < 0xf) {
      iVar7 = iVar4;
    }
    bVar3 = LogMessage::Loggable(LS_INFO);
    if (bVar3) {
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/agc/agc_manager_direct.cc"
                 ,400,LS_INFO);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"[agc] rms_error=",0x10);
      poVar5 = (ostream *)std::ostream::operator<<(&local_1b0,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"target_compression=",0x13);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->target_compression_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"residual_gain=",0xe);
      std::ostream::operator<<(poVar5,iVar7);
      if (bVar3) {
        LogMessage::~LogMessage(&local_1b0);
      }
    }
    if (iVar9 != 2) {
      uVar8 = (ulong)(uint)this->level_;
      if (0xff < uVar8) {
        __assert_fail("level >= 0 && level <= kMaxMicLevel",
                      "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/agc/agc_manager_direct.cc"
                      ,0x40,"int webrtc::(anonymous namespace)::LevelFromGainError(int, int)");
      }
      piVar1 = kGainMap + uVar8;
      if (iVar10 < 1) {
        do {
          iVar4 = (int)uVar8;
          if (iVar4 < 0xd) break;
          piVar6 = kGainMap + uVar8;
          uVar8 = (ulong)(iVar4 - 1);
        } while (iVar7 < *piVar6 - *piVar1);
      }
      else {
        piVar6 = kGainMap + uVar8;
        do {
          iVar4 = (int)uVar8;
          uVar8 = (ulong)(iVar4 + 1);
          if (0xfe < iVar4) break;
          iVar10 = *piVar6;
          piVar6 = piVar6 + 1;
        } while (iVar10 - *piVar1 < iVar7);
      }
      SetLevel(this,iVar4);
    }
  }
  return;
}

Assistant:

void AgcManagerDirect::UpdateGain() {
  int rms_error = 0;
  if (!agc_->GetRmsErrorDb(&rms_error)) {
    // No error update ready.
    return;
  }
  // The compressor will always add at least kMinCompressionGain. In effect,
  // this adjusts our target gain upward by the same amount and rms_error
  // needs to reflect that.
  rms_error += kMinCompressionGain;

  // Handle as much error as possible with the compressor first.
  int raw_compression = std::max(std::min(rms_error, max_compression_gain_),
                                 kMinCompressionGain);
  // Deemphasize the compression gain error. Move halfway between the current
  // target and the newly received target. This serves to soften perceptible
  // intra-talkspurt adjustments, at the cost of some adaptation speed.
  if ((raw_compression == max_compression_gain_ &&
      target_compression_ == max_compression_gain_ - 1) ||
      (raw_compression == kMinCompressionGain &&
      target_compression_ == kMinCompressionGain + 1)) {
    // Special case to allow the target to reach the endpoints of the
    // compression range. The deemphasis would otherwise halt it at 1 dB shy.
    target_compression_ = raw_compression;
  } else {
    target_compression_ = (raw_compression - target_compression_) / 2
        + target_compression_;
  }

  // Residual error will be handled by adjusting the volume slider. Use the
  // raw rather than deemphasized compression here as we would otherwise
  // shrink the amount of slack the compressor provides.
  int residual_gain = rms_error - raw_compression;
  residual_gain = std::min(std::max(residual_gain, -kMaxResidualGainChange),
      kMaxResidualGainChange);
  LOG(LS_INFO) << "[agc] rms_error=" << rms_error << ", "
               << "target_compression=" << target_compression_ << ", "
               << "residual_gain=" << residual_gain;
  if (residual_gain == 0)
    return;

  SetLevel(LevelFromGainError(residual_gain, level_));
}